

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::NewClassExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,NewClassExpressionSyntax *this,size_t index)

{
  __index_type _Var1;
  ArgumentListSyntax *pAVar2;
  
  if (index == 1) {
    pAVar2 = this->argList;
  }
  else {
    if (index != 0) {
      parsing::Token::Token((Token *)__return_storage_ptr__);
      _Var1 = '\0';
      goto LAB_0021d630;
    }
    pAVar2 = (ArgumentListSyntax *)(this->scopedNew).ptr;
  }
  *(ArgumentListSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pAVar2;
  _Var1 = '\x01';
LAB_0021d630:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax NewClassExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return scopedNew.get();
        case 1: return argList;
        default: return nullptr;
    }
}